

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

void Str_MuxInputsCollect_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  uint Entry;
  
  for (; (pObj->field_0x3 & 0x40) != 0;
      pObj = pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff)) {
    Entry = 0xffffffff;
    if (p->pMuxes != (uint *)0x0) {
      pGVar2 = p->pObjs;
      if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) goto LAB_007c652c;
      uVar1 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555];
      if (uVar1 != 0) {
        if ((int)uVar1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        Entry = uVar1 >> 1;
      }
    }
    Vec_IntPush(vNodes,Entry);
    Str_MuxInputsCollect_rec(p,pObj + -(*(ulong *)pObj & 0x1fffffff),vNodes);
  }
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->nObjs)) {
    Vec_IntPush(vNodes,(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555);
    return;
  }
LAB_007c652c:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Str_MuxInputsCollect_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes )
{
    if ( !pObj->fMark0 )
    {
        Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        return;
    }
    Vec_IntPush( vNodes, Gia_ObjFaninId2p(p, pObj) );
    Str_MuxInputsCollect_rec( p, Gia_ObjFanin0(pObj), vNodes );
    Str_MuxInputsCollect_rec( p, Gia_ObjFanin1(pObj), vNodes );
}